

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idaRoberts_dns.c
# Opt level: O3

int jacrob(sunrealtype tt,sunrealtype cj,N_Vector yy,N_Vector yp,N_Vector resvec,SUNMatrix JJ,
          void *user_data,N_Vector tempv1,N_Vector tempv2,N_Vector tempv3)

{
  long *plVar1;
  double *pdVar2;
  long lVar3;
  
  lVar3 = N_VGetArrayPointer(SUB84(tt,0));
  plVar1 = *(long **)((long)JJ->content + 0x20);
  pdVar2 = (double *)*plVar1;
  *pdVar2 = -0.04 - cj;
  pdVar2[1] = 0.04;
  pdVar2[2] = 1.0;
  pdVar2 = (double *)plVar1[1];
  *pdVar2 = *(double *)(lVar3 + 0x10) * 10000.0;
  pdVar2[1] = (*(double *)(lVar3 + 0x10) * -10000.0 + *(double *)(lVar3 + 8) * -60000000.0) - cj;
  pdVar2[2] = 1.0;
  pdVar2 = (double *)plVar1[2];
  *pdVar2 = *(double *)(lVar3 + 8) * 10000.0;
  pdVar2[1] = *(double *)(lVar3 + 8) * -10000.0;
  pdVar2[2] = 1.0;
  return 0;
}

Assistant:

int jacrob(sunrealtype tt, sunrealtype cj, N_Vector yy, N_Vector yp,
           N_Vector resvec, SUNMatrix JJ, void* user_data, N_Vector tempv1,
           N_Vector tempv2, N_Vector tempv3)
{
  sunrealtype* yval;

  yval = N_VGetArrayPointer(yy);

  IJth(JJ, 1, 1) = SUN_RCONST(-0.04) - cj;
  IJth(JJ, 2, 1) = SUN_RCONST(0.04);
  IJth(JJ, 3, 1) = ONE;
  IJth(JJ, 1, 2) = SUN_RCONST(1.0e4) * yval[2];
  IJth(JJ, 2, 2) = SUN_RCONST(-1.0e4) * yval[2] - SUN_RCONST(6.0e7) * yval[1] -
                   cj;
  IJth(JJ, 3, 2) = ONE;
  IJth(JJ, 1, 3) = SUN_RCONST(1.0e4) * yval[1];
  IJth(JJ, 2, 3) = SUN_RCONST(-1.0e4) * yval[1];
  IJth(JJ, 3, 3) = ONE;

  return (0);
}